

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall Json::Reader::decodeString(Reader *this,Token *token,string *decoded)

{
  Location extra;
  byte bVar1;
  bool bVar2;
  int iVar3;
  uint cp;
  Location end;
  Location current;
  uint unicode;
  string local_68;
  Location local_48;
  Reader *local_40;
  uint local_34;
  
  local_40 = this;
  std::__cxx11::string::reserve((ulong)decoded);
  local_48 = token->start_ + 1;
  end = token->end_ + -1;
  do {
    if (local_48 == end) {
      return true;
    }
    extra = local_48 + 1;
    if (*local_48 == '\"') {
      iVar3 = 3;
      local_48 = extra;
    }
    else {
      if (*local_48 != '\\') goto LAB_004e93f2;
      if (extra == end) {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        local_48 = extra;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"Empty escape sequence in string","");
        addError(local_40,&local_68,token,extra);
LAB_004e92e6:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
LAB_004e9301:
        iVar3 = 1;
        goto LAB_004e93ff;
      }
      extra = local_48 + 2;
      bVar1 = local_48[1];
      local_48 = extra;
      if (bVar1 < 0x62) {
        if (((bVar1 != 0x22) && (bVar1 != 0x2f)) && (bVar1 != 0x5c)) goto switchD_004e9324_caseD_6f;
        goto LAB_004e93f2;
      }
      switch(bVar1) {
      case 0x6e:
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
switchD_004e9324_caseD_6f:
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"Bad escape sequence in string","");
        addError(local_40,&local_68,token,extra);
        goto LAB_004e92e6;
      case 0x72:
        break;
      case 0x74:
        break;
      case 0x75:
        bVar2 = decodeUnicodeCodePoint(local_40,token,&local_48,end,&local_34);
        if (!bVar2) goto LAB_004e9301;
        codePointToUTF8_abi_cxx11_(&local_68,(Json *)(ulong)local_34,cp);
        std::__cxx11::string::_M_append((char *)decoded,(ulong)local_68._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        iVar3 = 1;
        if (!bVar2) goto LAB_004e93ff;
        goto LAB_004e93fd;
      default:
        if ((bVar1 != 0x66) && (bVar1 != 0x62)) goto switchD_004e9324_caseD_6f;
      }
LAB_004e93f2:
      local_48 = extra;
      std::__cxx11::string::push_back((char)decoded);
LAB_004e93fd:
      iVar3 = 0;
    }
LAB_004e93ff:
    if (iVar3 != 0) {
      return iVar3 == 3;
    }
  } while( true );
}

Assistant:

bool Reader::decodeString(Token& token, JSONCPP_STRING& decoded) {
  decoded.reserve(static_cast<size_t>(token.end_ - token.start_ - 2));
  Location current = token.start_ + 1; // skip '"'
  Location end = token.end_ - 1;       // do not include '"'
  while (current != end) {
    Char c = *current++;
    if (c == '"')
      break;
    else if (c == '\\') {
      if (current == end)
        return addError("Empty escape sequence in string", token, current);
      Char escape = *current++;
      switch (escape) {
      case '"':
        decoded += '"';
        break;
      case '/':
        decoded += '/';
        break;
      case '\\':
        decoded += '\\';
        break;
      case 'b':
        decoded += '\b';
        break;
      case 'f':
        decoded += '\f';
        break;
      case 'n':
        decoded += '\n';
        break;
      case 'r':
        decoded += '\r';
        break;
      case 't':
        decoded += '\t';
        break;
      case 'u': {
        unsigned int unicode;
        if (!decodeUnicodeCodePoint(token, current, end, unicode))
          return false;
        decoded += codePointToUTF8(unicode);
      } break;
      default:
        return addError("Bad escape sequence in string", token, current);
      }
    } else {
      decoded += c;
    }
  }
  return true;
}